

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O1

bool __thiscall BamTools::FilterTool::FilterToolPrivate::Run(FilterToolPrivate *this)

{
  FilterSettings *pFVar1;
  size_t __n;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  istream *piVar7;
  ostream *poVar8;
  BamMultiReader reader;
  BamWriter writer;
  string headerText;
  BamAlignment al;
  BamMultiReader BStack_288;
  BamWriter local_280;
  BamRegion local_278;
  CompressionMode local_25c;
  value_type local_258;
  IndexType local_234;
  BamAlignment local_230;
  
  pFVar1 = this->m_settings;
  if ((pFVar1->HasInput == false) && (pFVar1->HasInputFilelist == false)) {
    psVar6 = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pFVar1->InputFiles,psVar6);
  }
  if (this->m_settings->HasInputFilelist == true) {
    std::ifstream::ifstream(&local_230,(this->m_settings->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bamtools filter ERROR: could not open input BAM file list... Aborting.",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    else {
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_230.Name._M_dataplus._M_p + -0x18) +
                                (char)&local_230);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_230,(string *)&local_258,cVar3);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&local_258);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
    }
    std::ifstream::~ifstream(&local_230);
    if (cVar2 == '\0') {
      return false;
    }
  }
  bVar4 = SetupFilters(this);
  if (!bVar4) {
    return false;
  }
  BamMultiReader::BamMultiReader(&BStack_288);
  bVar4 = BamMultiReader::Open(&BStack_288,&this->m_settings->InputFiles);
  if (!bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "bamtools filter ERROR: could not open input files for reading.",0x3e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    bVar4 = false;
    goto LAB_00159266;
  }
  BamMultiReader::GetHeaderText_abi_cxx11_(&local_258,&BStack_288);
  BamMultiReader::GetReferenceData((RefVector *)&local_230,&BStack_288);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&filterToolReferences,
             (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&local_230);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&local_230);
  pFVar1 = this->m_settings;
  psVar6 = Options::StandardOut_abi_cxx11_();
  __n = (pFVar1->OutputFilename)._M_string_length;
  local_25c = Compressed;
  if ((__n == psVar6->_M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp((pFVar1->OutputFilename)._M_dataplus._M_p,(psVar6->_M_dataplus)._M_p,__n),
      local_25c = Compressed, iVar5 == 0)))) {
    local_25c = this->m_settings->IsForceCompression ^ Uncompressed;
  }
  BamWriter::BamWriter(&local_280);
  BamWriter::SetCompressionMode(&local_280,&local_25c);
  bVar4 = BamWriter::Open(&local_280,&this->m_settings->OutputFilename,&local_258,
                          (RefVector *)&filterToolReferences);
  if (bVar4) {
    BamAlignment::BamAlignment(&local_230);
    if (this->m_settings->HasRegion == false) {
      while (bVar4 = BamMultiReader::GetNextAlignment(&BStack_288,&local_230), bVar4) {
        bVar4 = FilterEngine<BamTools::BamAlignmentChecker>::
                evaluateFilterRules<BamTools::BamAlignment>(&this->m_filterEngine,&local_230);
        if (bVar4) {
          BamWriter::SaveAlignment(&local_280,&local_230);
        }
      }
LAB_001591fb:
      BamMultiReader::Close(&BStack_288);
      bVar4 = true;
      BamWriter::Close(&local_280);
    }
    else {
      local_278.LeftRefID = -1;
      local_278.LeftPosition = -1;
      local_278.RightRefID = -1;
      local_278.RightPosition = -1;
      bVar4 = Utilities::ParseRegionString(&this->m_settings->Region,&BStack_288,&local_278);
      if (bVar4) {
        local_234 = STANDARD;
        BamMultiReader::LocateIndexes(&BStack_288,&local_234);
        bVar4 = BamMultiReader::HasIndexes(&BStack_288);
        if (bVar4) {
          bVar4 = BamMultiReader::SetRegion
                            (&BStack_288,&local_278.LeftRefID,&local_278.LeftPosition,
                             &local_278.RightRefID,&local_278.RightPosition);
          if (!bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "bamtools filter ERROR: set region failed. Check that REGION describes a valid range"
                       ,0x53);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_00159235;
          }
          while (bVar4 = BamMultiReader::GetNextAlignment(&BStack_288,&local_230), bVar4) {
            bVar4 = FilterEngine<BamTools::BamAlignmentChecker>::
                    evaluateFilterRules<BamTools::BamAlignment>(&this->m_filterEngine,&local_230);
            if (bVar4) {
              BamWriter::SaveAlignment(&local_280,&local_230);
            }
          }
        }
        else {
          while (bVar4 = BamMultiReader::GetNextAlignment(&BStack_288,&local_230), bVar4) {
            if ((((local_278.LeftRefID <= local_230.RefID) &&
                 (local_278.LeftPosition <= local_230.Length + local_230.Position)) &&
                (local_230.RefID <= local_278.RightRefID)) &&
               ((local_230.Position <= local_278.RightPosition &&
                (bVar4 = FilterEngine<BamTools::BamAlignmentChecker>::
                         evaluateFilterRules<BamTools::BamAlignment>
                                   (&this->m_filterEngine,&local_230), bVar4)))) {
              BamWriter::SaveAlignment(&local_280,&local_230);
            }
          }
        }
        goto LAB_001591fb;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"bamtools filter ERROR: could not parse REGION: ",0x2f);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->m_settings->Region)._M_dataplus._M_p,
                          (this->m_settings->Region)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                 ,0x5b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
LAB_00159235:
      BamMultiReader::Close(&BStack_288);
      bVar4 = false;
    }
    BamAlignment::~BamAlignment(&local_230);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bamtools filter ERROR: could not open ",0x26);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->m_settings->OutputFilename)._M_dataplus._M_p,
                        (this->m_settings->OutputFilename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," for writing.",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    BamMultiReader::Close(&BStack_288);
    bVar4 = false;
  }
  BamWriter::~BamWriter(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
LAB_00159266:
  BamMultiReader::~BamMultiReader(&BStack_288);
  return bVar4;
}

Assistant:

bool FilterTool::FilterToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools filter ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // initialize defined properties & user-specified filters
    // quit if failed
    if (!SetupFilters()) return false;

    // open reader without index
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools filter ERROR: could not open input files for reading." << std::endl;
        return false;
    }

    // retrieve reader header & reference data
    const std::string headerText = reader.GetHeaderText();
    filterToolReferences = reader.GetReferenceData();

    // determine compression mode for BamWriter
    bool writeUncompressed =
        (m_settings->OutputFilename == Options::StandardOut() && !m_settings->IsForceCompression);
    BamWriter::CompressionMode compressionMode = BamWriter::Compressed;
    if (writeUncompressed) compressionMode = BamWriter::Uncompressed;

    // open BamWriter
    BamWriter writer;
    writer.SetCompressionMode(compressionMode);
    if (!writer.Open(m_settings->OutputFilename, headerText, filterToolReferences)) {
        std::cerr << "bamtools filter ERROR: could not open " << m_settings->OutputFilename
                  << " for writing." << std::endl;
        reader.Close();
        return false;
    }

    // if no region specified, filter entire file
    BamAlignment al;
    if (!m_settings->HasRegion) {
        while (reader.GetNextAlignment(al)) {
            if (CheckAlignment(al)) writer.SaveAlignment(al);
        }
    }

    // otherwise attempt to use region as constraint
    else {

        // if region string parses OK
        BamRegion region;
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            // attempt to find index files
            reader.LocateIndexes();

            // if index data available for all BAM files, we can use SetRegion
            if (reader.HasIndexes()) {

                // attempt to use SetRegion(), if failed report error
                if (!reader.SetRegion(region.LeftRefID, region.LeftPosition, region.RightRefID,
                                      region.RightPosition)) {
                    std::cerr << "bamtools filter ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }

                // everything checks out, just iterate through specified region, filtering alignments
                while (reader.GetNextAlignment(al))
                    if (CheckAlignment(al)) writer.SaveAlignment(al);
            }

            // no index data available, we have to iterate through until we
            // find overlapping alignments
            else {
                while (reader.GetNextAlignment(al)) {
                    if ((al.RefID >= region.LeftRefID) &&
                        ((al.Position + al.Length) >= region.LeftPosition) &&
                        (al.RefID <= region.RightRefID) && (al.Position <= region.RightPosition)) {
                        if (CheckAlignment(al)) writer.SaveAlignment(al);
                    }
                }
            }
        }

        // error parsing REGION string
        else {
            std::cerr << "bamtools filter ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // clean up & exit
    reader.Close();
    writer.Close();
    return true;
}